

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

int __thiscall kj::anon_unknown_36::WebSocketImpl::close(WebSocketImpl *this,int __fd)

{
  undefined8 uVar1;
  ArrayDisposer *pAVar2;
  uint16_t in_CX;
  uint in_EDX;
  char *in_R8;
  ArrayPtr<const_unsigned_char> message;
  StringPtr reason;
  Promise<void> promise;
  Array<unsigned_char> payload;
  undefined1 local_40 [16];
  ArrayDisposer *pAStack_30;
  AsyncIoStream *local_28;
  
  reason.content.size_ = (size_t)in_R8;
  reason.content.ptr = in_R8;
  serializeClose((Array<unsigned_char> *)(local_40 + 8),(WebSocketImpl *)(ulong)in_EDX,in_CX,reason)
  ;
  message.size_ = local_40._8_8_;
  message.ptr = (uchar *)0x8;
  sendImpl((WebSocketImpl *)local_40,(byte)__fd,message);
  Promise<void>::attach<kj::Array<unsigned_char>>
            ((Promise<void> *)this,(Array<unsigned_char> *)local_40);
  uVar1 = local_40._0_8_;
  if ((PromiseArenaMember *)local_40._0_8_ != (PromiseArenaMember *)0x0) {
    local_40._0_8_ = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar1);
  }
  pAVar2 = pAStack_30;
  uVar1 = local_40._8_8_;
  if ((_func_int **)local_40._8_8_ != (_func_int **)0x0) {
    local_40._8_8_ = (_func_int **)0x0;
    pAStack_30 = (ArrayDisposer *)0x0;
    (**(local_28->super_AsyncInputStream)._vptr_AsyncInputStream)(local_28,uVar1,1,pAVar2,pAVar2,0);
  }
  return (int)this;
}

Assistant:

kj::Promise<void> close(uint16_t code, kj::StringPtr reason) override {
    kj::Array<byte> payload = serializeClose(code, reason);
    auto promise = sendImpl(OPCODE_CLOSE, payload);
    return promise.attach(kj::mv(payload));
  }